

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGrid
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  uint uVar2;
  AdjacencyGrid *this_00;
  AdjacencyGridLineSegment *pAVar3;
  AdjacencyGridPoint *pAVar4;
  TestError *this_01;
  int iVar5;
  uint local_38;
  uint local_34;
  uint x;
  uint y;
  uint nPoint;
  float dy;
  float dx;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  this_00 = (AdjacencyGrid *)operator_new(0x60);
  AdjacencyGrid::AdjacencyGrid(this_00);
  test_data->m_grid = this_00;
  iVar5 = this->m_grid_granulity + 1;
  test_data->m_grid->m_n_points = iVar5 * iVar5;
  pAVar3 = (AdjacencyGridLineSegment *)
           operator_new__((ulong)(this->m_n_line_segments * this->m_grid_granulity *
                                 this->m_grid_granulity) << 5);
  test_data->m_grid->m_line_segments = pAVar3;
  pAVar4 = (AdjacencyGridPoint *)operator_new__((ulong)test_data->m_grid->m_n_points * 0xc);
  test_data->m_grid->m_points = pAVar4;
  uVar1 = this->m_grid_granulity;
  uVar2 = this->m_grid_granulity;
  x = 0;
  for (local_34 = 0; local_34 < this->m_grid_granulity + 1; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < this->m_grid_granulity + 1; local_38 = local_38 + 1) {
      test_data->m_grid->m_points[x].index = x;
      test_data->m_grid->m_points[x].x = (1.0 / (float)uVar1) * (float)local_38;
      test_data->m_grid->m_points[x].y = (1.0 / (float)uVar2) * (float)local_34;
      x = x + 1;
    }
  }
  switch(test_data->m_mode) {
  case 10:
    createGridLineSegments(this,test_data);
    break;
  case 0xb:
    createGridLineSegments(this,test_data);
    createGridLineStrip(this,test_data);
    break;
  case 0xc:
    createGridTriangles(this,test_data);
    break;
  case 0xd:
    createGridTriangles(this,test_data);
    createGridTriangleStrip(this,test_data);
    break;
  default:
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Unrecognized test mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacencyTests.cpp"
               ,0x18d);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGrid(AdjacencyTestData& test_data)
{
	/* Create a grid object */
	test_data.m_grid = new AdjacencyGrid;

	/* Allocate space for grid elements */
	test_data.m_grid->m_n_points = (m_grid_granulity + 1) * (m_grid_granulity + 1);
	test_data.m_grid->m_line_segments =
		new AdjacencyGridLineSegment[m_n_line_segments * m_grid_granulity * m_grid_granulity];
	test_data.m_grid->m_points = new AdjacencyGridPoint[test_data.m_grid->m_n_points];

	/* Generate points */
	float		 dx		= 1.0f / static_cast<float>(m_grid_granulity);
	float		 dy		= 1.0f / static_cast<float>(m_grid_granulity);
	unsigned int nPoint = 0;

	for (unsigned int y = 0; y < m_grid_granulity + 1; ++y)
	{
		for (unsigned int x = 0; x < m_grid_granulity + 1; ++x, ++nPoint)
		{
			test_data.m_grid->m_points[nPoint].index = nPoint;
			test_data.m_grid->m_points[nPoint].x	 = dx * static_cast<float>(x);
			test_data.m_grid->m_points[nPoint].y	 = dy * static_cast<float>(y);
		}
	}

	switch (test_data.m_mode)
	{
	case GL_LINES_ADJACENCY_EXT:
	{
		/* Generate line segment data*/
		createGridLineSegments(test_data);

		break;
	}

	case GL_LINE_STRIP_ADJACENCY_EXT:
	{
		/* Line strip data generation requires line segment data to be present */
		createGridLineSegments(test_data);

		/* Generate line strip data */
		createGridLineStrip(test_data);

		break;
	}

	case GL_TRIANGLES_ADJACENCY_EXT:
	{
		/* Generate triangles data */
		createGridTriangles(test_data);

		break;
	}

	case GL_TRIANGLE_STRIP_ADJACENCY_EXT:
	{
		/* Triangle strip data generation requires triangle data to be present */
		createGridTriangles(test_data);

		/* Generate triangle strip data */
		createGridTriangleStrip(test_data);

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized test mode");
	}
	}
}